

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_reader.c
# Opt level: O2

int main(void)

{
  int __fd;
  ssize_t sVar1;
  char data;
  
  __fd = open("/tmp/myfifo",2);
  if (__fd != 0) {
    puts("Waiting for characters.....");
    do {
      do {
        sVar1 = read(__fd,&data,1);
      } while (sVar1 == 0);
      fputc(0x20,_stderr);
    } while( true );
  }
  perror("Cannot open fifo");
  unlink("/tmp/myfifo");
  exit(1);
}

Assistant:

int main ()
{
    char data = ' ';
    char * myfifo = "/tmp/myfifo";
    
    int fd = open(myfifo, O_RDWR);
    
    if (fd == 0) 
    {
        perror("Cannot open fifo");
        unlink(myfifo);exit(1);
        
    }
    printf("Waiting for characters.....\n");
    while (data != '#') 
    {
        while (read(fd, &data, 1) && (data != '#'))
            fprintf(stderr, "%c", data);
        
    }
    close(fd);
    unlink(myfifo);
    return 0;
    
}